

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address.cpp
# Opt level: O0

void __thiscall sockpp::inet_address::inet_address(inet_address *this,uint32_t addr,in_port_t port)

{
  uint16_t uVar1;
  uint32_t uVar2;
  in_port_t port_local;
  uint32_t addr_local;
  inet_address *this_local;
  
  sock_address::sock_address(&this->super_sock_address);
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__inet_address_00119a60;
  (this->addr_).sin_family = 0;
  (this->addr_).sin_port = 0;
  (this->addr_).sin_addr.s_addr = 0;
  memset((this->addr_).sin_zero,0,8);
  (this->addr_).sin_family = 2;
  uVar2 = htonl(addr);
  (this->addr_).sin_addr.s_addr = uVar2;
  uVar1 = htons(port);
  (this->addr_).sin_port = uVar1;
  return;
}

Assistant:

inet_address::inet_address(uint32_t addr, in_port_t port) {
    addr_.sin_family = AF_INET;
    addr_.sin_addr.s_addr = htonl(addr);
    addr_.sin_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr_.sin_len = (uint8_t)SZ;
#endif
}